

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_lcy_blyp.c
# Opt level: O2

void xc_hyb_gga_xc_lcy_blyp_init(xc_func_type *p)

{
  double gamma;
  
  gamma = 0.75;
  xc_hyb_gga_xc_lcy_blyp_init::funcs_coef[0] = 1.0;
  xc_hyb_gga_xc_lcy_blyp_init::funcs_coef[1] = 1.0;
  xc_mix_init(p,2,xc_hyb_gga_xc_lcy_blyp_init::funcs_id,xc_hyb_gga_xc_lcy_blyp_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,&gamma);
  xc_hyb_init_camy(p,1.0,-1.0,gamma);
  return;
}

Assistant:

void
xc_hyb_gga_xc_lcy_blyp_init(xc_func_type *p)
{
  static int   funcs_id  [2] = {XC_GGA_X_SFAT, XC_GGA_C_LYP};
  static double funcs_coef[2];

  double gamma = 0.75;

  funcs_coef[0] = 1.0;
  funcs_coef[1] = 1.0;

  xc_mix_init(p, 2, funcs_id, funcs_coef);

  xc_func_set_ext_params(p->func_aux[0], &gamma);

  xc_hyb_init_camy(p, 1.0, -1.0, gamma);
}